

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_quantization_attribute_decoder.cc
# Opt level: O0

bool __thiscall
draco::SequentialQuantizationAttributeDecoder::Init
          (SequentialQuantizationAttributeDecoder *this,PointCloudDecoder *decoder,int attribute_id)

{
  bool bVar1;
  DataType DVar2;
  PointAttribute *this_00;
  undefined4 in_EDX;
  PointCloudDecoder *in_RSI;
  PointAttribute *attribute;
  undefined8 in_stack_ffffffffffffffd8;
  int32_t attribute_id_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined1 local_1;
  
  attribute_id_00 = (int32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  bVar1 = SequentialIntegerAttributeDecoder::Init
                    ((SequentialIntegerAttributeDecoder *)in_RSI,
                     (PointCloudDecoder *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),attribute_id_00
                    );
  if (bVar1) {
    PointCloudDecoder::point_cloud(in_RSI);
    this_00 = PointCloud::attribute
                        ((PointCloud *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),attribute_id_00);
    DVar2 = GeometryAttribute::data_type(&this_00->super_GeometryAttribute);
    if (DVar2 == DT_FLOAT32) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SequentialQuantizationAttributeDecoder::Init(PointCloudDecoder *decoder,
                                                  int attribute_id) {
  if (!SequentialIntegerAttributeDecoder::Init(decoder, attribute_id)) {
    return false;
  }
  const PointAttribute *const attribute =
      decoder->point_cloud()->attribute(attribute_id);
  // Currently we can quantize only floating point arguments.
  if (attribute->data_type() != DT_FLOAT32) {
    return false;
  }
  return true;
}